

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O3

void chrono::TriangleNormalsSmooth
               (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                *normals,vector<int,_std::allocator<int>_> *accumul)

{
  int *piVar1;
  double dVar2;
  pointer pCVar3;
  pointer piVar4;
  double dVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  pCVar3 = (normals->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(normals->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3;
  if (lVar8 != 0) {
    pdVar6 = pCVar3->m_data + 2;
    uVar7 = (lVar8 >> 3) * -0x5555555555555555;
    piVar4 = (accumul->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      piVar1 = piVar4 + uVar9;
      uVar9 = uVar9 + 1;
      dVar10 = 1.0 / (double)*piVar1;
      dVar2 = *pdVar6;
      dVar5 = pdVar6[-1];
      ((ChVector<double> *)(pdVar6 + -2))->m_data[0] =
           dVar10 * ((ChVector<double> *)(pdVar6 + -2))->m_data[0];
      pdVar6[-1] = dVar10 * dVar5;
      *pdVar6 = dVar10 * dVar2;
      pdVar6 = pdVar6 + 3;
    } while ((uVar9 & 0xffffffff) <= uVar7 && uVar7 - (uVar9 & 0xffffffff) != 0);
  }
  return;
}

Assistant:

void TriangleNormalsSmooth(std::vector<ChVector<>>& normals, std::vector<int>& accumul) {
    for (unsigned int nn = 0; nn < normals.size(); ++nn) {
        normals[nn] = normals[nn] * (1.0 / (double)accumul[nn]);
    }
}